

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseChunk
          (Status *__return_storage_ptr__,JsonStreamParser *this,StringPiece chunk)

{
  long lVar1;
  char *pcVar2;
  StringPiece message;
  undefined1 local_70 [8];
  Status result;
  undefined1 local_38 [16];
  
  if (chunk.length_ == 0) {
    Status::Status(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  (this->json_).ptr_ = chunk.ptr_;
  (this->json_).length_ = chunk.length_;
  (this->p_).ptr_ = (this->json_).ptr_;
  (this->p_).length_ = (this->json_).length_;
  this->finishing_ = false;
  RunParser((Status *)local_70,this);
  if (local_70._0_4_ == OK) {
    SkipWhitespace(this);
    lVar1 = (this->p_).length_;
    if (lVar1 == 0) {
      (this->leftover_)._M_string_length = 0;
      *(this->leftover_)._M_dataplus._M_p = '\0';
    }
    else {
      if ((this->stack_).c.
          super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          (this->stack_).c.
          super__Deque_base<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        message.length_ = 0x27;
        message.ptr_ = "Parsing terminated before end of input.";
        ReportFailure(__return_storage_ptr__,this,message);
        goto LAB_00319925;
      }
      pcVar2 = (this->p_).ptr_;
      result.error_message_.field_2._8_8_ = local_38;
      if (pcVar2 == (char *)0x0) {
        local_38[0] = 0;
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)((long)&result.error_message_.field_2 + 8),pcVar2,pcVar2 + lVar1);
      }
      std::__cxx11::string::operator=
                ((string *)&this->leftover_,
                 (string *)(result.error_message_.field_2._M_local_buf + 8));
      if ((undefined1 *)result.error_message_.field_2._8_8_ != local_38) {
        operator_delete((void *)result.error_message_.field_2._8_8_);
      }
    }
    Status::Status(__return_storage_ptr__);
  }
  else {
    Status::Status(__return_storage_ptr__,(Status *)local_70);
  }
LAB_00319925:
  if ((size_type *)result._0_8_ != &result.error_message_._M_string_length) {
    operator_delete((void *)result._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseChunk(StringPiece chunk) {
  // Do not do any work if the chunk is empty.
  if (chunk.empty()) return util::Status();

  p_ = json_ = chunk;

  finishing_ = false;
  util::Status result = RunParser();
  if (!result.ok()) return result;

  SkipWhitespace();
  if (p_.empty()) {
    // If we parsed everything we had, clear the leftover.
    leftover_.clear();
  } else {
    // If we do not expect anything i.e. stack is empty, and we have non-empty
    // string left to parse, we report an error.
    if (stack_.empty()) {
      return ReportFailure("Parsing terminated before end of input.");
    }
    // If we expect future data i.e. stack is non-empty, and we have some
    // unparsed data left, we save it for later parse.
    leftover_ = std::string(p_);
  }
  return util::Status();
}